

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O3

void lsp::LanguageService::start(string *address,uint32_t port)

{
  MessageParser *pMVar1;
  __shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  XmlParser *__tmp;
  bool bVar7;
  undefined1 local_1c8 [35];
  undefined1 local_1a5;
  uint32_t local_1a4;
  request_callback local_1a0;
  request_callback local_180;
  request_callback local_160;
  request_callback local_140;
  request_callback local_120;
  request_callback local_100;
  request_callback local_e0;
  request_callback local_c0;
  request_callback local_a0;
  notification_callback local_80;
  notification_callback local_60;
  notification_callback local_40;
  
  local_1c8._0_8_ = (MessageParser *)0x0;
  local_1a4 = port;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lsp::IOHandler,std::allocator<lsp::IOHandler>,std::__cxx11::string&,unsigned_int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8),(IOHandler **)local_1c8,
             (allocator<lsp::IOHandler> *)&local_1a5,address,&local_1a4);
  _Var2._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
  _Var2._M_ptr = (element_type *)local_1c8._0_8_;
  local_1c8._0_8_ = (MessageParser *)0x0;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var4._M_pi = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  bVar7 = ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2> = _Var2;
  if (bVar7) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
  }
  local_1c8._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lsp::MessageParser,std::allocator<lsp::MessageParser>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8),
             (MessageParser **)local_1c8,(allocator<lsp::MessageParser> *)&local_1a5);
  _Var3._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
  _Var3._M_ptr = (element_type *)local_1c8._0_8_;
  local_1c8._0_8_ = (MessageParser *)0x0;
  local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var4._M_pi = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  bVar7 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2> = _Var3;
  if (bVar7) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
    }
  }
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00175808;
  xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var6 + 1);
  *(element_type **)&p_Var6[1]._M_use_count =
       xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6[1]._vptr__Sp_counted_base =
       (_func_int **)
       xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var4 = xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  bVar7 = xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  if (bVar7) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pMVar1 = (MessageParser *)(local_1c8 + 0x10);
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"initialized","");
  local_40.super__Function_base._M_functor._8_8_ = 0;
  local_40.super__Function_base._M_functor._M_unused._M_object = notification_initialized;
  local_40._M_invoker =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_40.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_notification_callback(peVar5,(string *)local_1c8,&local_40);
  if (local_40.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.super__Function_base._M_manager)
              ((_Any_data *)&local_40,(_Any_data *)&local_40,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"exit","");
  local_60.super__Function_base._M_functor._8_8_ = 0;
  local_60.super__Function_base._M_functor._M_unused._M_object = notification_exit;
  local_60._M_invoker =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_60.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_notification_callback(peVar5,(string *)local_1c8,&local_60);
  if (local_60.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_60.super__Function_base._M_manager)
              ((_Any_data *)&local_60,(_Any_data *)&local_60,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"workspace/didChangeConfiguration","");
  local_80.super__Function_base._M_functor._8_8_ = 0;
  local_80.super__Function_base._M_functor._M_unused._M_object =
       notification_workspace_didChangeConfiguration;
  local_80._M_invoker =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_80.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_notification_callback(peVar5,(string *)local_1c8,&local_80);
  if (local_80.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.super__Function_base._M_manager)
              ((_Any_data *)&local_80,(_Any_data *)&local_80,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"initialize","");
  local_a0.super__Function_base._M_functor._8_8_ = 0;
  local_a0.super__Function_base._M_functor._M_unused._M_object = request_initialize;
  local_a0._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_a0.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_a0);
  if (local_a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a0.super__Function_base._M_manager)
              ((_Any_data *)&local_a0,(_Any_data *)&local_a0,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"shutdown","");
  local_c0.super__Function_base._M_functor._8_8_ = 0;
  local_c0.super__Function_base._M_functor._M_unused._M_object = request_shutdown;
  local_c0._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_c0.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_c0);
  if (local_c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.super__Function_base._M_manager)
              ((_Any_data *)&local_c0,(_Any_data *)&local_c0,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"textDocument/definition","");
  local_e0.super__Function_base._M_functor._8_8_ = 0;
  local_e0.super__Function_base._M_functor._M_unused._M_object = request_textDocument_definition;
  local_e0._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_e0.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_e0);
  if (local_e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0.super__Function_base._M_manager)
              ((_Any_data *)&local_e0,(_Any_data *)&local_e0,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"textDocument/references","");
  local_100.super__Function_base._M_functor._8_8_ = 0;
  local_100.super__Function_base._M_functor._M_unused._M_object = request_textDocument_references;
  local_100._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_100.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_100);
  if (local_100.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_100.super__Function_base._M_manager)
              ((_Any_data *)&local_100,(_Any_data *)&local_100,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"textDocument/hover","");
  local_120.super__Function_base._M_functor._8_8_ = 0;
  local_120.super__Function_base._M_functor._M_unused._M_object = request_textDocument_hover;
  local_120._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_120.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_120);
  if (local_120.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_120.super__Function_base._M_manager)
              ((_Any_data *)&local_120,(_Any_data *)&local_120,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"treeView/getChildren","");
  local_140.super__Function_base._M_functor._8_8_ = 0;
  local_140.super__Function_base._M_functor._M_unused._M_object = request_treeView_getChildren;
  local_140._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_140.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_140);
  if (local_140.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_140.super__Function_base._M_manager)
              ((_Any_data *)&local_140,(_Any_data *)&local_140,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"textDocument/goToOwner","");
  local_160.super__Function_base._M_functor._8_8_ = 0;
  local_160.super__Function_base._M_functor._M_unused._M_object = request_textDocument_owner;
  local_160._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_160.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_160);
  if (local_160.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_160.super__Function_base._M_manager)
              ((_Any_data *)&local_160,(_Any_data *)&local_160,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"treeView/getNearestShortname","");
  local_180.super__Function_base._M_functor._8_8_ = 0;
  local_180.super__Function_base._M_functor._M_unused._M_object =
       request_treeView_getNearestShortname;
  local_180._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_180.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_180);
  if (local_180.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_180.super__Function_base._M_manager)
              ((_Any_data *)&local_180,(_Any_data *)&local_180,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  peVar5 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c8._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"treeView/getParentElement","");
  local_1a0.super__Function_base._M_functor._8_8_ = 0;
  local_1a0.super__Function_base._M_functor._M_unused._M_object = request_treeView_getParentElement;
  local_1a0._M_invoker =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_invoke;
  local_1a0.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
       ::_M_manager;
  MessageParser::register_request_callback(peVar5,(string *)local_1c8,&local_1a0);
  if (local_1a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1a0.super__Function_base._M_manager)
              ((_Any_data *)&local_1a0,(_Any_data *)&local_1a0,__destroy_functor);
  }
  if ((MessageParser *)local_1c8._0_8_ != pMVar1) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  run();
  return;
}

Assistant:

void lsp::LanguageService::start(std::string address, uint32_t port)
{
    ioHandler_ = std::make_shared<lsp::IOHandler>(address, port);
    messageParser_ = std::make_shared<lsp::MessageParser>();
    xmlParser_ = std::make_shared<XmlParser>();

    //register Callbacks here
    messageParser_->register_notification_callback("initialized", lsp::LanguageService::notification_initialized);
    messageParser_->register_notification_callback("exit", lsp::LanguageService::notification_exit);
    messageParser_->register_notification_callback("workspace/didChangeConfiguration", lsp::LanguageService::notification_workspace_didChangeConfiguration);
    messageParser_->register_request_callback("initialize", lsp::LanguageService::request_initialize);
    messageParser_->register_request_callback("shutdown", lsp::LanguageService::request_shutdown);
    messageParser_->register_request_callback("textDocument/definition", lsp::LanguageService::request_textDocument_definition);
    messageParser_->register_request_callback("textDocument/references", lsp::LanguageService::request_textDocument_references);
    messageParser_->register_request_callback("textDocument/hover", lsp::LanguageService::request_textDocument_hover);
    messageParser_->register_request_callback("treeView/getChildren", lsp::LanguageService::request_treeView_getChildren);
    messageParser_->register_request_callback("textDocument/goToOwner", lsp::LanguageService::request_textDocument_owner);
    messageParser_->register_request_callback("treeView/getNearestShortname", lsp::LanguageService::request_treeView_getNearestShortname);
    messageParser_->register_request_callback("treeView/getParentElement", lsp::LanguageService::request_treeView_getParentElement);

    //begin the main run loop
    run();
}